

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageSorters.h
# Opt level: O2

void __thiscall FIX::message_order::message_order(message_order *this,message_order *copy)

{
  (this->m_groupOrder).m_size = 0;
  (this->m_groupOrder).m_buffer = (int *)0x0;
  FIX::message_order::operator=(this,copy);
  return;
}

Assistant:

message_order( const message_order& copy ) 
  { *this = copy; }